

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_read_legacy_binary(void)

{
  int iVar1;
  undefined8 uVar2;
  bson_subtype_t *pbVar3;
  uint8_t **ppuVar4;
  uint32_t *puVar5;
  uint8_t *binary;
  uint32_t len;
  bson_subtype_t subtype;
  _Bool r;
  bson_t b;
  bson_error_t error;
  char **json;
  char *jsons [3];
  undefined4 uVar6;
  uint8_t *local_398;
  uint local_38c;
  bson_subtype_t local_388;
  byte local_381;
  undefined1 local_380 [200];
  undefined1 local_2b8 [8];
  undefined1 auStack_2b0 [504];
  char **local_b8;
  char *local_b0;
  char *local_a8;
  undefined8 local_a0;
  
  local_b0 = "{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}";
  local_a8 = "{\"x\": {\"$type\": \"05\", \"$binary\": \"Zm9v\"}}";
  local_a0 = 0;
  local_b8 = &local_b0;
  while( true ) {
    if (*local_b8 == (char *)0x0) {
      return;
    }
    local_381 = bson_init_from_json(local_380,*local_b8,0xffffffffffffffff,local_2b8);
    local_381 = local_381 & 1;
    if (local_381 == 0) {
      fprintf(_stderr,"FAIL:%s:%d  %s()\n  %s\n  %s\n\n",
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,0x4e6,"test_bson_json_read_legacy_binary","r",auStack_2b0);
      fflush(_stderr);
      abort();
    }
    uVar2 = bson_bcone_magic();
    pbVar3 = bcon_ensure_subtype_ptr(&local_388);
    ppuVar4 = bcon_ensure_const_uint8_ptr_ptr(&local_398);
    puVar5 = bcon_ensure_uint32_ptr(&local_38c);
    bcon_extract(local_380,"x",uVar2,4,pbVar3,ppuVar4,puVar5,0);
    uVar6 = (undefined4)((ulong)puVar5 >> 0x20);
    if (local_388 != BSON_SUBTYPE_MD5) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: %d %s %d\n%s:%d  %s()\n",(ulong)local_388,"==",5,
              "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c"
              ,CONCAT44(uVar6,0x4e8),"test_bson_json_read_legacy_binary");
      abort();
    }
    if (local_38c != 3) break;
    if (local_398 != (uint8_t *)"foo") {
      iVar1 = strcmp((char *)local_398,"foo");
      if (iVar1 != 0) {
        fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",local_398,"foo");
        abort();
      }
    }
    bson_destroy(local_380);
    local_b8 = local_b8 + 1;
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: %u %s %u\n%s:%d  %s()\n",(ulong)local_38c,"==",3,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          CONCAT44(uVar6,0x4e9),"test_bson_json_read_legacy_binary");
  abort();
}

Assistant:

static void
test_bson_json_read_legacy_binary (void)
{
   const char *jsons[] = {"{\"x\": {\"$binary\": \"Zm9v\", \"$type\": \"05\"}}",
                          "{\"x\": {\"$type\": \"05\", \"$binary\": \"Zm9v\"}}",
                          NULL};

   const char **json;
   bson_error_t error;
   bson_t b;
   bool r;
   bson_subtype_t subtype;
   uint32_t len;
   const uint8_t *binary;

   for (json = jsons; *json; json++) {
      r = bson_init_from_json (&b, *json, -1, &error);

      ASSERT_OR_PRINT (r, error);
      BCON_EXTRACT (&b, "x", BCONE_BIN (subtype, binary, len));
      ASSERT_CMPINT ((int) subtype, ==, 5);
      ASSERT_CMPUINT32 (len, ==, (uint32_t) 3);
      ASSERT_CMPSTR ((const char *) binary, "foo");

      bson_destroy (&b);
   }
}